

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form4_ConvertToGrayScale(ConvertToGrayScaleForm4 ConvertToGrayScale)

{
  byte bVar1;
  reference pvVar2;
  reference pvVar3;
  Image *in_RDI;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  size;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined4 in_stack_fffffffffffffe18;
  uint32_t in_stack_fffffffffffffe1c;
  uint8_t in_stack_fffffffffffffe26;
  uint8_t in_stack_fffffffffffffe27;
  undefined8 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  value_type vVar4;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  uint32_t in_stack_fffffffffffffe44;
  undefined8 in_stack_fffffffffffffe48;
  size_type sVar5;
  uint32_t *in_stack_fffffffffffffe60;
  uint8_t value;
  uint32_t in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  value_type width;
  undefined4 in_stack_fffffffffffffe70;
  value_type y;
  undefined4 in_stack_fffffffffffffe74;
  value_type x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe78;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *this;
  undefined4 local_138;
  undefined4 local_134;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_130;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_118;
  pair<unsigned_int,_unsigned_int> local_fc;
  pair<unsigned_int,_unsigned_int> local_f4;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_e8 [2];
  undefined1 local_a8 [96];
  undefined1 local_48 [40];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  Image *local_8;
  
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffe1c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (uint32_t)((ulong)in_stack_fffffffffffffe28 >> 0x20),
             (uint32_t)in_stack_fffffffffffffe28,in_stack_fffffffffffffe27,in_stack_fffffffffffffe26
            );
  Test_Helper::uniformRGBImage
            ((uint8_t)((uint)in_stack_fffffffffffffe3c >> 0x18),
             (Image *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d13d9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (uint32_t)((ulong)in_stack_fffffffffffffe28 >> 0x20),
             (uint32_t)in_stack_fffffffffffffe28,in_stack_fffffffffffffe27,in_stack_fffffffffffffe26
            );
  Test_Helper::uniformImage
            ((uint8_t)((ulong)in_stack_fffffffffffffe48 >> 0x38),(uint32_t)in_stack_fffffffffffffe48
             ,in_stack_fffffffffffffe44,
             (Image *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d1442);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)0x1d1457);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
           CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
           (allocator_type *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)0x1d1480);
  local_f4 = Unit_Test::imageSize
                       ((Image *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  pvVar2 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](local_e8,0);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar2,&local_f4);
  local_fc = Unit_Test::imageSize
                       ((Image *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  this = local_e8;
  pvVar2 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](this,1);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar2,&local_fc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d1528);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d153a);
  Unit_Test::generateRoi
            (this,in_stack_fffffffffffffe78,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             (uint32_t *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe60);
  sVar5 = 0;
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_118,0);
  width = *pvVar3;
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_130,sVar5);
  y = *pvVar3;
  sVar5 = 1;
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_118,1);
  x = *pvVar3;
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_130,sVar5);
  value = (uint8_t)(sVar5 >> 0x38);
  (*(code *)local_8)(local_48,width,y,local_a8,x,*pvVar3,local_134,local_138);
  sVar5 = 1;
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_118,1);
  vVar4 = *pvVar3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_130,sVar5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  bVar1 = Unit_Test::verifyImage(local_8,x,y,width,in_stack_fffffffffffffe68,value);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(vVar4,in_stack_fffffffffffffe30));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(vVar4,in_stack_fffffffffffffe30));
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)CONCAT44(vVar4,in_stack_fffffffffffffe30));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d16d0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d16dd);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(vVar4,in_stack_fffffffffffffe30));
  return (bool)(bVar1 & 1);
}

Assistant:

bool form4_ConvertToGrayScale(ConvertToGrayScaleForm4 ConvertToGrayScale)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const PenguinV_Image::Image input  = uniformRGBImage( intensity[0] );
        PenguinV_Image::Image output = uniformImage   ( intensity[1] );

        std::vector < std::pair <uint32_t, uint32_t> > size( 2 );

        size[0] = imageSize( input );
        size[1] = imageSize( output );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( size, roiX, roiY, roiWidth, roiHeight );

        ConvertToGrayScale( input, roiX[0], roiY[0], output, roiX[1], roiY[1], roiWidth, roiHeight );

        return verifyImage( output, roiX[1], roiY[1], roiWidth, roiHeight, intensity[0] );
    }